

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibObjPrint_rec(Dar_LibObj_t *pObj)

{
  Dar_LibObj_t *pDVar1;
  Dar_LibObj_t *pObj_local;
  
  if (((ulong)*pObj >> 0x23 & 1) == 0) {
    printf("(");
    pDVar1 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
    Dar_LibObjPrint_rec(pDVar1);
    if (((ulong)*pObj >> 0x20 & 1) != 0) {
      printf("\'");
    }
    pDVar1 = Dar_LibObj(s_DarLib,SUB84(*pObj,2) & 0xffff);
    Dar_LibObjPrint_rec(pDVar1);
    if (((ulong)*pObj >> 0x20 & 1) != 0) {
      printf("\'");
    }
    printf(")");
  }
  else {
    printf("%c",(ulong)((int)((long)pObj - (long)s_DarLib->pObjs >> 3) + 0x61));
  }
  return;
}

Assistant:

void Dar_LibObjPrint_rec( Dar_LibObj_t * pObj )
{
    if ( pObj->fTerm )
    {
        printf( "%c", 'a' + (int)(pObj - s_DarLib->pObjs) );
        return;
    }
    printf( "(" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan0) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    Dar_LibObjPrint_rec( Dar_LibObj(s_DarLib, pObj->Fan1) );
    if ( pObj->fCompl0 )
        printf( "\'" );
    printf( ")" );
}